

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.h
# Opt level: O0

void __thiscall depspawn::internal::ThreadPool::launch_theads(ThreadPool *this)

{
  void *in_RSI;
  ThreadPool *in_RDI;
  lock_guard<std::mutex> my_guard_lock;
  lock_guard<std::mutex> *in_stack_fffffffffffffff0;
  
  if (in_RDI->nthreads_in_use_ != 0) {
    wait(in_RDI,in_RSI);
    std::lock_guard<std::mutex>::lock_guard(in_stack_fffffffffffffff0,(mutex_type *)in_RDI);
    in_RDI->ready_ = true;
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x12cbdd);
    std::condition_variable::notify_all();
  }
  return;
}

Assistant:

void launch_theads()
  {
    if (nthreads_in_use_) {
      wait();
      {
        std::lock_guard<std::mutex> my_guard_lock(mutex_);
        ready_ = true;
      }
      cond_var_.notify_all();
    }
  }